

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Leaf::loadChildren
          (Leaf *this,LDIterator *children)

{
  int iVar1;
  undefined4 extraout_var;
  SelectedSummand local_80;
  SelectedSummand local_50;
  
  while( true ) {
    iVar1 = (*children->_core->_vptr_IteratorCore[2])();
    if ((char)iVar1 == '\0') break;
    iVar1 = (*children->_core->_vptr_IteratorCore[3])();
    Kernel::SelectedSummand::SelectedSummand
              (&local_80,(SelectedSummand *)CONCAT44(extraout_var,iVar1));
    Kernel::SelectedSummand::SelectedSummand(&local_50,&local_80);
    (*(this->super_Node)._vptr_Node[9])(this,&local_50);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::Leaf::loadChildren(LDIterator children)
{
  while(children.hasNext()) {
    // TODO move instead of copying here
    insert(*children.next());
  }
}